

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet_tests.cpp
# Opt level: O0

void __thiscall wallet::wallet_tests::LoadReceiveRequests::test_method(LoadReceiveRequests *this)

{
  string *in_RDI;
  long in_FS_OFFSET;
  DatabaseFormat *__end2;
  DatabaseFormat *__begin2;
  DatabaseFormat (*__range2) [1];
  DatabaseFormat format;
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  OutputType in_stack_fffffffffffffef4;
  function<void_(std::shared_ptr<wallet::CWallet>)> *in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff18;
  OutputType in_stack_ffffffffffffff1c;
  OutputType *local_c0;
  function<void_(std::shared_ptr<wallet::CWallet>)> *f;
  function<void_(std::shared_ptr<wallet::CWallet>)> local_a0 [3];
  OutputType local_2c;
  DatabaseFormat local_28 [8];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  f = (function<void_(std::shared_ptr<wallet::CWallet>)> *)&DATABASE_FORMATS;
  for (local_c0 = &DATABASE_FORMATS; (array<OutputType,_4UL> *)local_c0 != &OUTPUT_TYPES;
      local_c0 = local_c0 + 1) {
    local_2c = *local_c0;
    tinyformat::format<wallet::DatabaseFormat>
              ((char *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),local_28);
    in_stack_ffffffffffffff1c = local_2c;
    std::function<void(std::shared_ptr<wallet::CWallet>)>::
    function<wallet::wallet_tests::LoadReceiveRequests::test_method()::__0,void>
              (in_stack_fffffffffffffef8,
               (anon_class_1_0_00000001 *)
               CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
    TestLoadWallet(in_RDI,name.field_2._12_4_,f);
    std::function<void_(std::shared_ptr<wallet::CWallet>)>::~function
              ((function<void_(std::shared_ptr<wallet::CWallet>)> *)in_stack_fffffffffffffee8);
    std::function<void(std::shared_ptr<wallet::CWallet>)>::
    function<wallet::wallet_tests::LoadReceiveRequests::test_method()::__1,void>
              (in_stack_fffffffffffffef8,
               (anon_class_1_0_00000001 *)
               CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
    TestLoadWallet(in_RDI,name.field_2._12_4_,f);
    std::function<void_(std::shared_ptr<wallet::CWallet>)>::~function
              ((function<void_(std::shared_ptr<wallet::CWallet>)> *)in_stack_fffffffffffffee8);
    in_stack_fffffffffffffef8 = local_a0;
    in_stack_fffffffffffffef4 = local_2c;
    std::function<void(std::shared_ptr<wallet::CWallet>)>::
    function<wallet::wallet_tests::LoadReceiveRequests::test_method()::__2,void>
              (in_stack_fffffffffffffef8,
               (anon_class_1_0_00000001 *)CONCAT44(local_2c,in_stack_fffffffffffffef0));
    TestLoadWallet(in_RDI,name.field_2._12_4_,f);
    std::function<void_(std::shared_ptr<wallet::CWallet>)>::~function
              ((function<void_(std::shared_ptr<wallet::CWallet>)> *)in_stack_fffffffffffffee8);
    std::__cxx11::string::~string(in_stack_fffffffffffffee8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_FIXTURE_TEST_CASE(LoadReceiveRequests, TestingSetup)
{
    for (DatabaseFormat format : DATABASE_FORMATS) {
        const std::string name{strprintf("receive-requests-%i", format)};
        TestLoadWallet(name, format, [](std::shared_ptr<CWallet> wallet) EXCLUSIVE_LOCKS_REQUIRED(wallet->cs_wallet) {
            BOOST_CHECK(!wallet->IsAddressPreviouslySpent(PKHash()));
            WalletBatch batch{wallet->GetDatabase()};
            BOOST_CHECK(batch.WriteAddressPreviouslySpent(PKHash(), true));
            BOOST_CHECK(batch.WriteAddressPreviouslySpent(ScriptHash(), true));
            BOOST_CHECK(wallet->SetAddressReceiveRequest(batch, PKHash(), "0", "val_rr00"));
            BOOST_CHECK(wallet->EraseAddressReceiveRequest(batch, PKHash(), "0"));
            BOOST_CHECK(wallet->SetAddressReceiveRequest(batch, PKHash(), "1", "val_rr10"));
            BOOST_CHECK(wallet->SetAddressReceiveRequest(batch, PKHash(), "1", "val_rr11"));
            BOOST_CHECK(wallet->SetAddressReceiveRequest(batch, ScriptHash(), "2", "val_rr20"));
        });
        TestLoadWallet(name, format, [](std::shared_ptr<CWallet> wallet) EXCLUSIVE_LOCKS_REQUIRED(wallet->cs_wallet) {
            BOOST_CHECK(wallet->IsAddressPreviouslySpent(PKHash()));
            BOOST_CHECK(wallet->IsAddressPreviouslySpent(ScriptHash()));
            auto requests = wallet->GetAddressReceiveRequests();
            auto erequests = {"val_rr11", "val_rr20"};
            BOOST_CHECK_EQUAL_COLLECTIONS(requests.begin(), requests.end(), std::begin(erequests), std::end(erequests));
            RunWithinTxn(wallet->GetDatabase(), /*process_desc*/"test", [](WalletBatch& batch){
                BOOST_CHECK(batch.WriteAddressPreviouslySpent(PKHash(), false));
                BOOST_CHECK(batch.EraseAddressData(ScriptHash()));
                return true;
            });
        });
        TestLoadWallet(name, format, [](std::shared_ptr<CWallet> wallet) EXCLUSIVE_LOCKS_REQUIRED(wallet->cs_wallet) {
            BOOST_CHECK(!wallet->IsAddressPreviouslySpent(PKHash()));
            BOOST_CHECK(!wallet->IsAddressPreviouslySpent(ScriptHash()));
            auto requests = wallet->GetAddressReceiveRequests();
            auto erequests = {"val_rr11"};
            BOOST_CHECK_EQUAL_COLLECTIONS(requests.begin(), requests.end(), std::begin(erequests), std::end(erequests));
        });
    }
}